

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset16_s.c
# Opt level: O0

errno_t memset16_s(uint16_t *dest,rsize_t len,uint16_t value)

{
  long lVar1;
  undefined2 in_DX;
  void *in_RSI;
  uint16_t *in_RDI;
  long in_FS_OFFSET;
  undefined2 in_stack_ffffffffffffffdc;
  errno_t error;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  error = CONCAT22(in_DX,in_stack_ffffffffffffffdc);
  if (in_RDI == (uint16_t *)0x0) {
    invoke_safe_mem_constraint_handler((char *)0x0,in_RSI,error);
    local_c = 400;
  }
  else if (in_RSI == (void *)0x0) {
    invoke_safe_mem_constraint_handler((char *)in_RDI,(void *)0x0,error);
    local_c = 0x191;
  }
  else if (in_RSI < (void *)0x8000001) {
    mem_prim_set16(in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),(uint16_t)((ulong)in_RSI >> 0x10));
    local_c = 0;
  }
  else {
    invoke_safe_mem_constraint_handler((char *)in_RDI,in_RSI,error);
    local_c = 0x193;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memset16_s (uint16_t *dest, rsize_t len, uint16_t value)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memset16_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (len == 0) {
        invoke_safe_mem_constraint_handler("memset16_s: len is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (len > RSIZE_MAX_MEM16) {
        invoke_safe_mem_constraint_handler("memset16_s: len exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    mem_prim_set16(dest, len, value);

    return (RCNEGATE(EOK));
}